

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmeander.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  size_t sStack_40;
  
  if (argc - 5U < 0xfffffffe) {
    pcVar5 = "Usage: dmeander Length HalfPeriod [PhaseShift]\n";
    sStack_40 = 0x2f;
  }
  else {
    iVar1 = atoi(argv[1]);
    if (iVar1 < 1) {
      pcVar5 = "Length must be positive\n";
      sStack_40 = 0x18;
    }
    else {
      iVar2 = atoi(argv[2]);
      if (0 < iVar2) {
        iVar6 = 0;
        iVar3 = 0;
        if (argc == 4) {
          iVar3 = atoi(argv[3]);
        }
        iVar3 = iVar3 % (iVar2 * 2);
        do {
          if (iVar6 == iVar1) {
            return 0;
          }
          do {
            iVar4 = iVar3;
            if (iVar4 < iVar2) {
              pcVar5 = "1";
              goto LAB_001011e7;
            }
            iVar3 = 0;
          } while (SBORROW4(iVar4,iVar2 * 2) == iVar4 + iVar2 * -2 < 0);
          pcVar5 = "-1";
LAB_001011e7:
          puts(pcVar5);
          iVar3 = iVar4 + 1;
          iVar6 = iVar6 + 1;
        } while( true );
      }
      pcVar5 = "Half of period must be positive\n";
      sStack_40 = 0x20;
    }
  }
  fwrite(pcVar5,sStack_40,1,_stderr);
  return 1;
}

Assistant:

int main (int argc, char* argv[])
{
    if(3 != argc && 4 != argc) {
	fprintf(stderr, "Usage: dmeander Length HalfPeriod [PhaseShift]\n");
	return 1;
    }

    int	nLength = atoi(argv[1]);
    if(nLength <= 0) {
	fprintf(stderr, "Length must be positive\n");
	return 1;
    }
    int	iHalfPeriod = atoi(argv[2]);
    if(iHalfPeriod <= 0) {
	fprintf(stderr, "Half of period must be positive\n");
	return 1;
    }
    int	iPeriod = 2 * iHalfPeriod;
    int iPhase = (4 == argc)? atoi(argv[3]): 0;

    int	i, j = iPhase % iPeriod;
    for(i = 0; i < nLength; ) {
	if(j < iHalfPeriod) {
	    printf("1\n");
	    ++j;
	} else if(j < iPeriod) {
	    printf("-1\n");
	    ++j;
	} else {
	    j = 0;
	    continue;
	}
	++i;
    }
    return 0;
}